

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_buffer.cc
# Opt level: O0

bool __thiscall draco::DataBuffer::Update(DataBuffer *this,void *data,int64_t size,int64_t offset)

{
  uchar *__first;
  size_type sVar1;
  uchar *__last;
  long in_RCX;
  long in_RDX;
  uchar *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  uint8_t *byte_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffd0;
  
  if (in_RSI == (uchar *)0x0) {
    if (in_RDX + in_RCX < 0) {
      return false;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_ffffffffffffffd0,(size_type)in_RDI);
  }
  else {
    if (in_RDX < 0) {
      return false;
    }
    __first = (uchar *)(in_RDX + in_RCX);
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDI);
    if ((long)sVar1 < (long)__first) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (in_stack_ffffffffffffffd0,(size_type)in_RDI);
    }
    __last = in_RSI + in_RDX;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x184d66);
    std::copy<unsigned_char_const*,unsigned_char*>(__first,__last,in_RSI);
  }
  in_RDI[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       in_RDI[1].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish + 1;
  return true;
}

Assistant:

bool DataBuffer::Update(const void *data, int64_t size, int64_t offset) {
  if (data == nullptr) {
    if (size + offset < 0) {
      return false;
    }
    // If no data is provided, just resize the buffer.
    data_.resize(size + offset);
  } else {
    if (size < 0) {
      return false;
    }
    if (size + offset > static_cast<int64_t>(data_.size())) {
      data_.resize(size + offset);
    }
    const uint8_t *const byte_data = static_cast<const uint8_t *>(data);
    std::copy(byte_data, byte_data + size, data_.data() + offset);
  }
  descriptor_.buffer_update_count++;
  return true;
}